

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

yajl_gen yajl_gen_alloc(yajl_alloc_funcs *afs)

{
  yajl_buf pyVar1;
  long *in_RDI;
  yajl_alloc_funcs afsBuffer;
  yajl_gen g;
  long local_38;
  yajl_alloc_funcs *in_stack_ffffffffffffffd0;
  long *local_10;
  yajl_gen local_8;
  
  local_10 = &local_38;
  if (in_RDI == (long *)0x0) {
    yajl_set_default_alloc_funcs((yajl_alloc_funcs *)&local_38);
  }
  else if (((*in_RDI == 0) || (in_RDI[1] == 0)) || (local_10 = in_RDI, in_RDI[2] == 0)) {
    return (yajl_gen)0x0;
  }
  local_8 = (yajl_gen)(*(code *)*local_10)(local_10[3]);
  if (local_8 == (yajl_gen)0x0) {
    local_8 = (yajl_gen)0x0;
  }
  else {
    memset(local_8,0,0x240);
    (local_8->alloc).malloc = (yajl_malloc_func)*local_10;
    (local_8->alloc).realloc = (yajl_realloc_func)local_10[1];
    (local_8->alloc).free = (yajl_free_func)local_10[2];
    (local_8->alloc).ctx = (void *)local_10[3];
    local_8->print = yajl_buf_append;
    pyVar1 = yajl_buf_alloc(in_stack_ffffffffffffffd0);
    local_8->ctx = pyVar1;
    local_8->indentString = "    ";
  }
  return local_8;
}

Assistant:

yajl_gen
yajl_gen_alloc(const yajl_alloc_funcs * afs)
{
    yajl_gen g = NULL;
    yajl_alloc_funcs afsBuffer;

    /* first order of business is to set up memory allocation routines */
    if (afs != NULL) {
        if (afs->malloc == NULL || afs->realloc == NULL || afs->free == NULL)
        {
            return NULL;
        }
    } else {
        yajl_set_default_alloc_funcs(&afsBuffer);
        afs = &afsBuffer;
    }

    g = (yajl_gen) YA_MALLOC(afs, sizeof(struct yajl_gen_t));
    if (!g) return NULL;

    memset((void *) g, 0, sizeof(struct yajl_gen_t));
    /* copy in pointers to allocation routines */
    memcpy((void *) &(g->alloc), (const void *) afs, sizeof(yajl_alloc_funcs));

    g->print = (yajl_print_t)&yajl_buf_append;
    g->ctx = yajl_buf_alloc(&(g->alloc));
    g->indentString = "    ";

    return g;
}